

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O3

int secp256k1_ecmult_pippenger_batch
              (secp256k1_callback *error_callback,secp256k1_scratch *scratch,secp256k1_gej *r,
              secp256k1_scalar *inp_g_sc,secp256k1_ecmult_multi_callback *cb,void *cbdata,
              size_t n_points,size_t cb_offset)

{
  ulong uVar1;
  int *piVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  byte bVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  uint64_t *puVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  long lVar18;
  ulong uVar19;
  secp256k1_ge *p1;
  secp256k1_scalar *s1;
  long *plVar20;
  void *pvVar21;
  secp256k1_gej *r_00;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  uint uVar26;
  uint uVar27;
  secp256k1_fe *rzr;
  size_t checkpoint;
  ulong uVar28;
  secp256k1_ge *psVar29;
  secp256k1_scalar *psVar30;
  secp256k1_gej *psVar31;
  size_t __n;
  uint uVar32;
  long lVar33;
  secp256k1_ge *psVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  ulong uVar38;
  long lVar39;
  long lVar40;
  uint uVar41;
  uint uVar42;
  long lVar43;
  byte bVar44;
  undefined1 auVar45 [16];
  secp256k1_gej running_sum;
  long local_170;
  ulong local_148;
  long local_138;
  uint local_c0;
  undefined1 local_b8 [32];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  uint64_t local_48;
  int local_40;
  
  bVar44 = 0;
  lVar18 = 0;
  do {
    if (scratch->magic[lVar18] != "scratch"[lVar18]) {
      (*error_callback->fn)("invalid scratch space",error_callback->data);
      checkpoint = 0;
      goto LAB_0012b55f;
    }
    lVar18 = lVar18 + 1;
  } while (lVar18 != 8);
  checkpoint = scratch->alloc_size;
LAB_0012b55f:
  r->infinity = 1;
  (r->x).n[0] = 0;
  (r->x).n[1] = 0;
  (r->x).n[2] = 0;
  (r->x).n[3] = 0;
  *(undefined1 (*) [16])((r->x).n + 4) = (undefined1  [16])0x0;
  (r->y).n[1] = 0;
  (r->y).n[2] = 0;
  (r->y).n[3] = 0;
  (r->y).n[4] = 0;
  (r->z).n[0] = 0;
  (r->z).n[1] = 0;
  (r->z).n[2] = 0;
  (r->z).n[3] = 0;
  (r->z).n[4] = 0;
  if (inp_g_sc == (secp256k1_scalar *)0x0 && n_points == 0) {
    return 1;
  }
  lVar18 = n_points * 2 + 2;
  uVar19 = 1;
  if ((((((1 < n_points) && (uVar19 = 2, 4 < n_points)) && (uVar19 = 3, 0x14 < n_points)) &&
       ((uVar19 = 4, 0x39 < n_points && (uVar19 = 5, 0x88 < n_points)))) &&
      ((uVar19 = 6, 0xeb < n_points &&
       ((uVar19 = 7, 0x4ec < n_points && (uVar19 = 9, 0x1144 < n_points)))))) &&
     (uVar19 = 10, 0x1ec8 < n_points)) {
    uVar19 = (ulong)(0xc - (n_points < 0x3eb3));
  }
  p1 = (secp256k1_ge *)secp256k1_scratch_alloc(error_callback,scratch,lVar18 * 0x58);
  s1 = (secp256k1_scalar *)secp256k1_scratch_alloc(error_callback,scratch,lVar18 * 0x20);
  plVar20 = (long *)secp256k1_scratch_alloc(error_callback,scratch,0x10);
  if ((plVar20 != (long *)0x0 && s1 != (secp256k1_scalar *)0x0) && p1 != (secp256k1_ge *)0x0) {
    pvVar21 = secp256k1_scratch_alloc(error_callback,scratch,lVar18 * 0x10);
    plVar20[1] = (long)pvVar21;
    uVar41 = (uint)uVar19;
    uVar26 = uVar41 + 1;
    bVar6 = (byte)uVar19;
    pvVar21 = secp256k1_scratch_alloc
                        (error_callback,scratch,
                         (ulong)(byte)((bVar6 | 0x80) / (byte)uVar26) * lVar18 * 4);
    *plVar20 = (long)pvVar21;
    r_00 = (secp256k1_gej *)secp256k1_scratch_alloc(error_callback,scratch,0x80L << (bVar6 & 0x3f));
    if (((plVar20[1] != 0) && (*plVar20 != 0)) && (r_00 != (secp256k1_gej *)0x0)) {
      if (inp_g_sc == (secp256k1_scalar *)0x0) {
        local_170 = 0;
      }
      else {
        uVar7 = inp_g_sc->d[0];
        uVar8 = inp_g_sc->d[1];
        uVar9 = inp_g_sc->d[3];
        s1->d[2] = inp_g_sc->d[2];
        s1->d[3] = uVar9;
        s1->d[0] = uVar7;
        s1->d[1] = uVar8;
        psVar29 = &secp256k1_ge_const_g;
        psVar34 = p1;
        for (lVar18 = 0xb; lVar18 != 0; lVar18 = lVar18 + -1) {
          (psVar34->x).n[0] = (psVar29->x).n[0];
          psVar29 = (secp256k1_ge *)((long)psVar29 + ((ulong)bVar44 * -2 + 1) * 8);
          psVar34 = (secp256k1_ge *)((long)psVar34 + (ulong)bVar44 * -0x10 + 8);
        }
        secp256k1_ecmult_endo_split(s1,s1 + 1,p1,p1 + 1);
        local_170 = 2;
      }
      if (n_points != 0) {
        psVar30 = (secp256k1_scalar *)((long)s1->d + (ulong)(uint)((int)local_170 << 5));
        psVar29 = p1 + local_170;
        do {
          iVar11 = (*cb)(psVar30,psVar29,cb_offset,cbdata);
          if (iVar11 == 0) goto LAB_0012b77a;
          secp256k1_ecmult_endo_split(psVar30,psVar30 + 1,psVar29,psVar29 + 1);
          local_170 = local_170 + 2;
          cb_offset = cb_offset + 1;
          psVar30 = psVar30 + 2;
          psVar29 = psVar29 + 2;
          n_points = n_points - 1;
        } while (n_points != 0);
      }
      uVar25 = (ulong)(uVar41 | 0x80) / (ulong)uVar26;
      if (local_170 != 0) {
        local_c0 = ~(uint)(-1L << ((byte)uVar26 & 0x3f));
        iVar12 = -2 << (bVar6 & 0x1f);
        iVar11 = (int)uVar25;
        uVar13 = iVar11 - 1;
        uVar32 = 0x80 - uVar13 * uVar26;
        lVar18 = 0;
        uVar14 = (uVar41 + 0x80) / uVar26;
        uVar35 = uVar14 - 1;
        uVar1 = uVar19 + 1;
        uVar22 = (uVar19 + 0x80) / uVar1;
        uVar23 = uVar22 - 1;
        local_138 = 0;
        uVar24 = uVar23;
LAB_0012b91e:
        psVar30 = s1 + lVar18;
        puVar10 = s1[lVar18].d;
        auVar45._0_4_ = -(uint)((int)puVar10[2] == 0 && (int)psVar30->d[0] == 0);
        auVar45._4_4_ =
             -(uint)(*(int *)((long)puVar10 + 0x14) == 0 && *(int *)((long)psVar30->d + 4) == 0);
        auVar45._8_4_ = -(uint)((int)(puVar10 + 2)[1] == 0 && (int)psVar30->d[1] == 0);
        auVar45._12_4_ =
             -(uint)(*(int *)((long)puVar10 + 0x1c) == 0 && *(int *)((long)psVar30->d + 0xc) == 0);
        uVar15 = movmskps((int)uVar24,auVar45);
        uVar24 = (ulong)(uVar15 ^ 0xf);
        if (((uVar15 ^ 0xf) != 0) && (uVar24 = lVar18 * 0x58, p1[lVar18].infinity == 0)) {
          psVar30 = s1 + lVar18;
          uVar24 = plVar20[1];
          *(long *)(uVar24 + 8 + local_138 * 0x10) = lVar18;
          lVar33 = *plVar20;
          piVar2 = (int *)(lVar33 + local_138 * uVar25 * 4);
          if (((psVar30->d[1] == 0 && psVar30->d[2] == 0) && psVar30->d[3] == 0) &&
              psVar30->d[0] == 0) {
            uVar15 = 0;
            memset(piVar2,0,(ulong)(uint)(iVar11 * 4));
          }
          else {
            uVar36 = (uint)psVar30->d[0];
            uVar15 = ~uVar36 & 1;
            *piVar2 = (uVar36 & local_c0) + uVar15;
            lVar39 = (ulong)uVar35 + 1;
            lVar33 = lVar33 + uVar22 * 4 * local_138;
            lVar40 = 0;
            uVar36 = uVar14;
            uVar16 = uVar35 * uVar26;
            do {
              uVar37 = uVar26;
              if (lVar40 == 0) {
                uVar37 = uVar32;
              }
              uVar27 = (uVar37 + uVar16) - 1 >> 6;
              uVar42 = uVar16 >> 6;
              if (uVar27 == uVar42) {
                uVar27 = (uint)(psVar30->d[uVar27] >> ((byte)uVar16 & 0x3f));
              }
              else {
                bVar44 = (byte)uVar16 & 0x3f;
                uVar27 = (uint)(psVar30->d[uVar42] >> bVar44) |
                         (uint)(psVar30->d[(ulong)uVar42 + 1] << 0x40 - bVar44);
              }
              if ((uVar27 & ~(uint)(-1L << ((byte)uVar37 & 0x3f))) != 0) {
                if (0 < (int)uVar23 - (int)lVar40) {
                  uVar28 = 1;
                  uVar38 = uVar19;
                  goto LAB_0012baa2;
                }
                break;
              }
              *(undefined4 *)(lVar33 + -4 + lVar39 * 4) = 0;
              lVar39 = lVar39 + -1;
              lVar40 = lVar40 + 1;
              uVar16 = uVar16 + ~uVar41;
              uVar36 = uVar36 - 1;
            } while (1 < lVar39);
          }
          goto LAB_0012bb61;
        }
        goto LAB_0012bb83;
      }
      r->infinity = 1;
      (r->x).n[0] = 0;
      (r->x).n[1] = 0;
      (r->x).n[2] = 0;
      (r->x).n[3] = 0;
      *(undefined1 (*) [16])((r->x).n + 4) = (undefined1  [16])0x0;
      (r->y).n[1] = 0;
      (r->y).n[2] = 0;
      (r->y).n[3] = 0;
      (r->y).n[4] = 0;
      (r->z).n[0] = 0;
      (r->z).n[1] = 0;
      (r->z).n[2] = 0;
      (r->z).n[3] = 0;
      (r->z).n[4] = 0;
      goto LAB_0012bfa0;
    }
  }
LAB_0012b77a:
  secp256k1_scratch_apply_checkpoint(error_callback,scratch,checkpoint);
  return 0;
LAB_0012baa2:
  do {
    uVar16 = uVar26;
    if (uVar35 == uVar28) {
      uVar16 = uVar32;
    }
    iVar5 = (int)uVar38;
    uVar37 = uVar16 + iVar5 >> 6;
    uVar27 = iVar5 + 1U >> 6;
    bVar44 = (byte)(iVar5 + 1U);
    if (uVar37 == uVar27) {
      uVar38 = psVar30->d[uVar37] >> (bVar44 & 0x3f);
    }
    else {
      bVar44 = bVar44 & 0x3f;
      uVar38 = psVar30->d[uVar27] >> bVar44 | psVar30->d[(ulong)uVar27 + 1] << 0x40 - bVar44;
    }
    uVar38 = ~(-1L << ((byte)uVar16 & 0x3f)) & uVar38;
    uVar16 = (uint)uVar38;
    if ((uVar38 & 1) == 0) {
      piVar2 = (int *)(lVar33 + -4 + uVar28 * 4);
      *piVar2 = *piVar2 + iVar12;
      uVar16 = uVar16 | 1;
    }
    *(uint *)(lVar33 + uVar28 * 4) = uVar16;
    if (1 < uVar28) {
      iVar17 = *(int *)(lVar33 + -4 + uVar28 * 4);
      if (iVar17 == -1) {
        iVar17 = *(int *)(lVar33 + -8 + uVar28 * 4);
        if (0 < iVar17) {
          iVar17 = iVar17 + iVar12;
          goto LAB_0012bb41;
        }
      }
      else if ((iVar17 == 1) && (iVar17 = *(int *)(lVar33 + -8 + uVar28 * 4), iVar17 < 0)) {
        iVar17 = iVar17 + (2 << (bVar6 & 0x1f));
LAB_0012bb41:
        *(int *)(lVar33 + -8 + uVar28 * 4) = iVar17;
        *(undefined4 *)(lVar33 + -4 + uVar28 * 4) = 0;
      }
    }
    uVar28 = uVar28 + 1;
    uVar38 = (ulong)(iVar5 + uVar26);
  } while (uVar36 != uVar28);
LAB_0012bb61:
  *(uint *)(uVar24 + local_138 * 0x10) = uVar15;
  local_138 = local_138 + 1;
LAB_0012bb83:
  lVar18 = lVar18 + 1;
  if (lVar18 == local_170) goto code_r0x0012bb8f;
  goto LAB_0012b91e;
code_r0x0012bb8f:
  r->infinity = 1;
  (r->x).n[0] = 0;
  (r->x).n[1] = 0;
  (r->x).n[2] = 0;
  (r->x).n[3] = 0;
  *(undefined1 (*) [16])((r->x).n + 4) = (undefined1  [16])0x0;
  (r->y).n[1] = 0;
  (r->y).n[2] = 0;
  (r->y).n[3] = 0;
  (r->y).n[4] = 0;
  (r->z).n[0] = 0;
  (r->z).n[1] = 0;
  (r->z).n[2] = 0;
  (r->z).n[3] = 0;
  (r->z).n[4] = 0;
  if (local_138 != 0) {
    lVar33 = 1L << (bVar6 & 0x3f);
    lVar39 = (ulong)((uVar41 + 0x80) / uVar26 - 1) << 2;
    uVar25 = (ulong)((int)lVar33 - 2);
    lVar18 = lVar33;
    psVar31 = r_00;
    local_148 = (ulong)uVar13;
    do {
      do {
        psVar31->infinity = 1;
        (psVar31->x).n[0] = 0;
        (psVar31->x).n[1] = 0;
        (psVar31->x).n[2] = 0;
        (psVar31->x).n[3] = 0;
        *(undefined1 (*) [16])((psVar31->x).n + 4) = (undefined1  [16])0x0;
        (psVar31->y).n[1] = 0;
        (psVar31->y).n[2] = 0;
        (psVar31->y).n[3] = 0;
        (psVar31->y).n[4] = 0;
        (psVar31->z).n[0] = 0;
        (psVar31->z).n[1] = 0;
        (psVar31->z).n[2] = 0;
        (psVar31->z).n[3] = 0;
        (psVar31->z).n[4] = 0;
        lVar18 = lVar18 + -1;
        psVar31 = psVar31 + 1;
      } while (lVar18 != 0);
      lVar43 = 8;
      lVar18 = local_138;
      lVar40 = lVar39;
      do {
        rzr = (secp256k1_fe *)*plVar20;
        uVar41 = *(uint *)((long)rzr->n + lVar40);
        lVar3 = *(long *)(plVar20[1] + lVar43);
        if ((local_148 == 0) && (*(int *)(plVar20[1] + -8 + lVar43) != 0)) {
          secp256k1_ge_neg((secp256k1_ge *)local_b8,p1 + lVar3);
          rzr = (secp256k1_fe *)0x0;
          secp256k1_gej_add_ge_var(r_00,r_00,(secp256k1_ge *)local_b8,(secp256k1_fe *)0x0);
        }
        if ((int)uVar41 < 1) {
          if ((int)uVar41 < 0) {
            uVar41 = ~uVar41;
            psVar29 = (secp256k1_ge *)local_b8;
            secp256k1_ge_neg(psVar29,p1 + lVar3);
            goto LAB_0012bd0b;
          }
        }
        else {
          uVar41 = uVar41 - 1;
          psVar29 = p1 + lVar3;
LAB_0012bd0b:
          rzr = (secp256k1_fe *)0x0;
          secp256k1_gej_add_ge_var
                    (r_00 + (uVar41 >> 1),r_00 + (uVar41 >> 1),psVar29,(secp256k1_fe *)0x0);
        }
        lVar43 = lVar43 + 0x10;
        lVar40 = lVar40 + ((uVar19 + 0x80) / uVar1) * 4;
        lVar18 = lVar18 + -1;
      } while (lVar18 != 0);
      uVar24 = uVar19;
      do {
        if (r->infinity == 0) {
          secp256k1_gej_double(r,r);
        }
        else {
          r->infinity = 1;
          (r->x).n[0] = 0;
          (r->x).n[1] = 0;
          (r->x).n[2] = 0;
          (r->x).n[3] = 0;
          *(undefined1 (*) [16])((r->x).n + 4) = (undefined1  [16])0x0;
          (r->y).n[1] = 0;
          (r->y).n[2] = 0;
          (r->y).n[3] = 0;
          (r->y).n[4] = 0;
          (r->z).n[0] = 0;
          (r->z).n[1] = 0;
          (r->z).n[2] = 0;
          (r->z).n[3] = 0;
          (r->z).n[4] = 0;
        }
        uVar41 = (int)uVar24 - 1;
        uVar24 = (ulong)uVar41;
      } while (uVar41 != 0);
      local_40 = 1;
      local_b8._0_16_ = (undefined1  [16])0x0;
      local_b8._16_16_ = (undefined1  [16])0x0;
      local_98 = (undefined1  [16])0x0;
      local_88 = (undefined1  [16])0x0;
      local_78 = (undefined1  [16])0x0;
      local_68 = (undefined1  [16])0x0;
      local_58 = (undefined1  [16])0x0;
      local_48 = 0;
      lVar18 = uVar25 + 2;
      psVar31 = r_00 + uVar25 + 1;
      do {
        secp256k1_gej_add_var((secp256k1_gej *)local_b8,(secp256k1_gej *)local_b8,psVar31,rzr);
        secp256k1_gej_add_var(r,r,(secp256k1_gej *)local_b8,rzr);
        lVar18 = lVar18 + -1;
        psVar31 = psVar31 + -1;
      } while (1 < lVar18);
      secp256k1_gej_add_var((secp256k1_gej *)local_b8,(secp256k1_gej *)local_b8,r_00,rzr);
      if (r->infinity == 0) {
        secp256k1_gej_double(r,r);
      }
      else {
        r->infinity = 1;
        (r->x).n[0] = 0;
        (r->x).n[1] = 0;
        (r->x).n[2] = 0;
        (r->x).n[3] = 0;
        *(undefined1 (*) [16])((r->x).n + 4) = (undefined1  [16])0x0;
        (r->y).n[1] = 0;
        (r->y).n[2] = 0;
        (r->y).n[3] = 0;
        (r->y).n[4] = 0;
        (r->z).n[0] = 0;
        (r->z).n[1] = 0;
        (r->z).n[2] = 0;
        (r->z).n[3] = 0;
        (r->z).n[4] = 0;
      }
      secp256k1_gej_add_var(r,r,(secp256k1_gej *)local_b8,rzr);
      lVar39 = lVar39 + -4;
      bVar4 = 0 < (long)local_148;
      lVar18 = lVar33;
      psVar31 = r_00;
      local_148 = local_148 - 1;
    } while (bVar4);
    if (local_170 == 0) goto LAB_0012bfa0;
  }
  lVar18 = 0;
  __n = ((uVar19 | 0x80) / uVar1) * 4;
  lVar33 = 0;
  do {
    *(undefined1 (*) [16])((long)s1->d + lVar33 * 2 + 0x10) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])((long)s1->d + lVar33 * 2) = (undefined1  [16])0x0;
    *(undefined4 *)(plVar20[1] + lVar33) = 0;
    memset((void *)(*plVar20 + lVar18),0,__n);
    lVar33 = lVar33 + 0x10;
    lVar18 = lVar18 + __n;
    local_170 = local_170 + -1;
  } while (local_170 != 0);
LAB_0012bfa0:
  uVar41 = 1;
  do {
    *(undefined1 (*) [16])((long)(r_00->z).n + 0x1c) = (undefined1  [16])0x0;
    (r_00->z).n[2] = 0;
    (r_00->z).n[3] = 0;
    (r_00->z).n[0] = 0;
    (r_00->z).n[1] = 0;
    (r_00->y).n[3] = 0;
    (r_00->y).n[4] = 0;
    (r_00->y).n[1] = 0;
    (r_00->y).n[2] = 0;
    *(undefined1 (*) [16])((r_00->x).n + 4) = (undefined1  [16])0x0;
    (r_00->x).n[2] = 0;
    (r_00->x).n[3] = 0;
    (r_00->x).n[0] = 0;
    (r_00->x).n[1] = 0;
    r_00 = r_00 + 1;
    uVar26 = uVar41 >> (bVar6 & 0x1f);
    uVar41 = uVar41 + 1;
  } while (uVar26 == 0);
  secp256k1_scratch_apply_checkpoint(error_callback,scratch,checkpoint);
  return 1;
}

Assistant:

static int secp256k1_ecmult_pippenger_batch(const secp256k1_callback* error_callback, secp256k1_scratch *scratch, secp256k1_gej *r, const secp256k1_scalar *inp_g_sc, secp256k1_ecmult_multi_callback cb, void *cbdata, size_t n_points, size_t cb_offset) {
    const size_t scratch_checkpoint = secp256k1_scratch_checkpoint(error_callback, scratch);
    /* Use 2(n+1) with the endomorphism, when calculating batch
     * sizes. The reason for +1 is that we add the G scalar to the list of
     * other scalars. */
    size_t entries = 2*n_points + 2;
    secp256k1_ge *points;
    secp256k1_scalar *scalars;
    secp256k1_gej *buckets;
    struct secp256k1_pippenger_state *state_space;
    size_t idx = 0;
    size_t point_idx = 0;
    int i, j;
    int bucket_window;

    secp256k1_gej_set_infinity(r);
    if (inp_g_sc == NULL && n_points == 0) {
        return 1;
    }
    bucket_window = secp256k1_pippenger_bucket_window(n_points);

    /* We allocate PIPPENGER_SCRATCH_OBJECTS objects on the scratch space. If
     * these allocations change, make sure to update the
     * PIPPENGER_SCRATCH_OBJECTS constant and pippenger_scratch_size
     * accordingly. */
    points = (secp256k1_ge *) secp256k1_scratch_alloc(error_callback, scratch, entries * sizeof(*points));
    scalars = (secp256k1_scalar *) secp256k1_scratch_alloc(error_callback, scratch, entries * sizeof(*scalars));
    state_space = (struct secp256k1_pippenger_state *) secp256k1_scratch_alloc(error_callback, scratch, sizeof(*state_space));
    if (points == NULL || scalars == NULL || state_space == NULL) {
        secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
        return 0;
    }
    state_space->ps = (struct secp256k1_pippenger_point_state *) secp256k1_scratch_alloc(error_callback, scratch, entries * sizeof(*state_space->ps));
    state_space->wnaf_na = (int *) secp256k1_scratch_alloc(error_callback, scratch, entries*(WNAF_SIZE(bucket_window+1)) * sizeof(int));
    buckets = (secp256k1_gej *) secp256k1_scratch_alloc(error_callback, scratch, ((size_t)1 << bucket_window) * sizeof(*buckets));
    if (state_space->ps == NULL || state_space->wnaf_na == NULL || buckets == NULL) {
        secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
        return 0;
    }

    if (inp_g_sc != NULL) {
        scalars[0] = *inp_g_sc;
        points[0] = secp256k1_ge_const_g;
        idx++;
        secp256k1_ecmult_endo_split(&scalars[0], &scalars[1], &points[0], &points[1]);
        idx++;
    }

    while (point_idx < n_points) {
        if (!cb(&scalars[idx], &points[idx], point_idx + cb_offset, cbdata)) {
            secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
            return 0;
        }
        idx++;
        secp256k1_ecmult_endo_split(&scalars[idx - 1], &scalars[idx], &points[idx - 1], &points[idx]);
        idx++;
        point_idx++;
    }

    secp256k1_ecmult_pippenger_wnaf(buckets, bucket_window, state_space, r, scalars, points, idx);

    /* Clear data */
    for(i = 0; (size_t)i < idx; i++) {
        secp256k1_scalar_clear(&scalars[i]);
        state_space->ps[i].skew_na = 0;
        for(j = 0; j < WNAF_SIZE(bucket_window+1); j++) {
            state_space->wnaf_na[i * WNAF_SIZE(bucket_window+1) + j] = 0;
        }
    }
    for(i = 0; i < 1<<bucket_window; i++) {
        secp256k1_gej_clear(&buckets[i]);
    }
    secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
    return 1;
}